

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_test.cpp
# Opt level: O0

int main(void)

{
  int *piVar1;
  int *piVar2;
  ostream *poVar3;
  int *b;
  int *a;
  
  piVar1 = Singleton<int>::GetInstance();
  piVar2 = Singleton<int>::GetInstance();
  if (piVar1 == piVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Singleton True");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Singleton False");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
	int & a = Singleton<int>::GetInstance();
	int & b = Singleton<int>::GetInstance();
	
	if ((&a) == (&b))
	{
		cout << "Singleton True" << endl;
	}
	else
	{
		cout << "Singleton False" << endl;
	}
}